

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniscript.h
# Opt level: O0

SatInfo miniscript::internal::operator|(SatInfo *a,SatInfo *b)

{
  long lVar1;
  byte *in_RSI;
  byte *in_RDI;
  long in_FS_OFFSET;
  SatInfo SVar2;
  SatInfo *in_stack_ffffffffffffffa8;
  undefined4 in_stack_ffffffffffffffb0;
  undefined4 in_stack_ffffffffffffffb4;
  undefined8 local_14;
  int32_t local_c;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  if ((*in_RDI & 1) == 0) {
    local_14 = *(undefined8 *)in_RSI;
    local_c = *(int32_t *)(in_RSI + 8);
  }
  else if ((*in_RSI & 1) == 0) {
    local_14 = *(undefined8 *)in_RDI;
    local_c = *(int32_t *)(in_RDI + 8);
  }
  else {
    std::max<int>((int *)CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),
                  (int *)in_stack_ffffffffffffffa8);
    std::max<int>((int *)CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),
                  (int *)in_stack_ffffffffffffffa8);
    SatInfo::SatInfo(in_stack_ffffffffffffffa8,0,0xee21b4);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    SVar2.exec = local_c;
    SVar2.valid = (bool)(undefined1)local_14;
    SVar2._1_3_ = local_14._1_3_;
    SVar2.netdiff = local_14._4_4_;
    return SVar2;
  }
  __stack_chk_fail();
}

Assistant:

SatInfo operator|(const SatInfo& a, const SatInfo& b) noexcept
    {
        // Union with an empty set is itself.
        if (!a.valid) return b;
        if (!b.valid) return a;
        // Otherwise the netdiff and exec of the union is the maximum of the individual values.
        return {std::max(a.netdiff, b.netdiff), std::max(a.exec, b.exec)};
    }